

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

my_rational my_rational_product(my_rational *a,my_rational *b)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  _Bool _Var4;
  wchar_t wVar5;
  long lVar6;
  size_t sVar7;
  ushort *puVar8;
  size_t sVar9;
  my_rational mVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint t;
  int iVar18;
  bool bVar19;
  uint16_t q_u16n [2];
  uint16_t a_u16n [2];
  uint16_t b_u16n [2];
  uint16_t d_u16n [4];
  uint16_t r_u16n [6];
  uint16_t n_u16n [4];
  uint16_t w_u16n [5];
  uint16_t sr_u16n [6];
  
  uVar14 = a->n;
  uVar16 = b->d;
  while (uVar16 != 0) {
    uVar12 = uVar14 % uVar16;
    uVar14 = uVar16;
    uVar16 = uVar12;
  }
  uVar16 = b->n;
  uVar12 = a->d;
  uVar3 = uVar16;
  while (uVar3 != 0) {
    uVar13 = uVar12 % uVar3;
    uVar12 = uVar3;
    uVar3 = uVar13;
  }
  uVar15 = (ulong)a->n / (ulong)uVar14;
  uVar11 = (ulong)a->d / (ulong)uVar12;
  uVar1 = (ulong)uVar16 / (ulong)uVar12;
  uVar2 = (ulong)b->d / (ulong)uVar14;
  if (((uVar16 < uVar12) || ((int)(uVar1 * uVar15 >> 0x20) == 0)) &&
     ((int)(uVar2 * uVar11 >> 0x20) == 0)) {
    mVar10.n = (int)uVar1 * (int)uVar15;
    mVar10.d = 0;
    uVar15 = (ulong)(uint)((int)uVar2 * (int)uVar11);
  }
  else {
    lVar6 = 1;
    do {
      uVar17 = uVar15;
      a_u16n[lVar6] = (uint16_t)uVar17;
      bVar19 = lVar6 != 0;
      lVar6 = lVar6 + -1;
      uVar15 = uVar17 >> 0x10;
    } while (bVar19);
    if (0xffff < (uint)uVar17) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x736,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    lVar6 = 1;
    do {
      uVar15 = uVar1;
      b_u16n[lVar6] = (uint16_t)uVar15;
      bVar19 = lVar6 != 0;
      lVar6 = lVar6 + -1;
      uVar1 = uVar15 >> 0x10;
    } while (bVar19);
    if (0xffff < (uint)uVar15) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x73a,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var4 = mul_u16n(n_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x73f,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    lVar6 = 1;
    do {
      uVar15 = uVar11;
      a_u16n[lVar6] = (uint16_t)uVar15;
      bVar19 = lVar6 != 0;
      lVar6 = lVar6 + -1;
      uVar11 = uVar15 >> 0x10;
    } while (bVar19);
    if (0xffff < (uint)uVar15) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x743,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    lVar6 = 1;
    do {
      uVar15 = uVar2;
      b_u16n[lVar6] = (uint16_t)uVar15;
      bVar19 = lVar6 != 0;
      lVar6 = lVar6 + -1;
      uVar2 = uVar15 >> 0x10;
    } while (bVar19);
    if (0xffff < (uint)uVar15) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x747,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var4 = mul_u16n(d_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x74c,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    wVar5 = div_u16n(q_u16n,r_u16n,w_u16n,n_u16n,d_u16n,2,4,4);
    uVar14 = 1;
    uVar16 = 0xffffffff;
    if ((wVar5 == L'\0') && (sVar7 = msb_u16n(q_u16n,2), sVar7 < 0x21)) {
      puVar8 = q_u16n + 1;
      iVar18 = 0;
      lVar6 = 0;
      do {
        iVar18 = iVar18 + ((uint)*puVar8 << ((byte)lVar6 & 0x1f));
        puVar8 = puVar8 + -1;
        bVar19 = lVar6 != 0x10;
        lVar6 = lVar6 + 0x10;
      } while (bVar19);
      if (iVar18 == -1) {
        uVar15 = 1;
      }
      else {
        uVar15 = 0xffffffff / (ulong)(iVar18 + 1);
      }
      lVar6 = 1;
      uVar14 = (uint)uVar15;
      do {
        uVar11 = uVar15;
        a_u16n[lVar6] = (uint16_t)uVar11;
        bVar19 = lVar6 != 0;
        lVar6 = lVar6 + -1;
        uVar15 = uVar11 >> 0x10;
      } while (bVar19);
      if (0xffff < (uint)uVar11) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x75d,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      _Var4 = mul_u16n(sr_u16n,r_u16n,a_u16n,6,4,2);
      if (_Var4) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x762,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      wVar5 = div_u16n(q_u16n,r_u16n,w_u16n,sr_u16n,d_u16n,2,6,4);
      if (wVar5 != L'\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x767,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      sVar7 = msb_u16n(q_u16n,2);
      if (0x20 < sVar7) {
        __assert_fail("msb_u16n(q_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x76a,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      puVar8 = q_u16n + 1;
      uVar12 = 0;
      lVar6 = 0;
      do {
        uVar12 = uVar12 + ((uint)*puVar8 << ((byte)lVar6 & 0x1f));
        puVar8 = puVar8 + -1;
        bVar19 = lVar6 != 0x10;
        lVar6 = lVar6 + 0x10;
      } while (bVar19);
      uVar16 = uVar12 + iVar18 * uVar14;
      if (CARRY4(uVar12,iVar18 * uVar14)) {
        __assert_fail("rn <= UINT_MAX - t",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x76c,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      sVar7 = msb_u16n(r_u16n,6);
      sVar9 = msb_u16n(d_u16n,4);
      if (sVar9 <= sVar7 + 1) {
        if (uVar16 == 0xffffffff) {
          __assert_fail("rn < UINT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x771,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        uVar16 = uVar16 + 1;
      }
    }
    mVar10 = my_rational_construct(uVar16,uVar14);
    uVar15 = (ulong)mVar10 >> 0x20;
  }
  return (my_rational)((ulong)mVar10 & 0xffffffff | uVar15 << 0x20);
}

Assistant:

struct my_rational my_rational_product(const struct my_rational *a,
		const struct my_rational *b)
{
	unsigned int g1 = gcd(a->n, b->d);
	unsigned int g2 = gcd(a->d, b->n);
	unsigned int anr = a->n / g1;
	unsigned int adr = a->d / g2;
	unsigned int bnr = b->n / g2;
	unsigned int bdr = b->d / g1;
	struct my_rational result;

	if ((bnr && anr > UINT_MAX / bnr) || (adr > UINT_MAX / bdr)) {
		/* Overflows in native arithmetic so approximate. */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t a_u16n[MP_DIGITS], b_u16n[MP_DIGITS];
		uint16_t n_u16n[2 * MP_DIGITS], d_u16n[2 * MP_DIGITS];
		uint16_t q_u16n[MP_DIGITS], r_u16n[3 * MP_DIGITS];
		uint16_t sr_u16n[3 * MP_DIGITS], w_u16n[2 * MP_DIGITS + 1];
		unsigned int rn, rd;
		bool over;

		over = ini_u16n(a_u16n, MP_DIGITS, anr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bnr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(n_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = ini_u16n(a_u16n, MP_DIGITS, adr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bdr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(d_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(q_u16n, r_u16n, w_u16n, n_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, 2 * MP_DIGITS) != 0);
		if (!over && msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT) {
			unsigned int t;

			rn = ext_u16n(q_u16n, MP_DIGITS);
			/*
			 * Use as large as possible of a denominator so the
			 * approximation is as accurate as possible.
			 */
			rd = (rn < UINT_MAX) ? UINT_MAX / (rn + 1) : 1;
			rn *= rd;
			over = ini_u16n(a_u16n, MP_DIGITS, rd);
			if (over) {
				assert(0);
			}
			over = mul_u16n(sr_u16n, r_u16n, a_u16n, 3 * MP_DIGITS,
				2 * MP_DIGITS, MP_DIGITS);
			if (over) {
				assert(0);
			}
			over = div_u16n(q_u16n, r_u16n, w_u16n, sr_u16n, d_u16n,
				MP_DIGITS, 3 * MP_DIGITS, 2 * MP_DIGITS);
			if (over) {
				assert(0);
			}
			assert(msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT);
			t = ext_u16n(q_u16n, MP_DIGITS);
			assert(rn <= UINT_MAX - t);
			rn += t;
			/* Approximate rounding to the nearest. */
			if (msb_u16n(r_u16n, 3 * MP_DIGITS) + 1
					>= msb_u16n(d_u16n, 2 * MP_DIGITS)) {
				assert(rn < UINT_MAX);
				++rn;
			}
		} else {
			rn = UINT_MAX;
			rd = 1;
		}
		return my_rational_construct(rn, rd);
#undef MP_DIGITS
	}
	result.n = anr * bnr;
	result.d = adr * bdr;
	return result;
}